

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

size_t __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::ByteSizeLong(GeneratedCodeInfo_Annotation *this)

{
  long lVar1;
  int iVar2;
  anon_union_56_1_493b367e_for_GeneratedCodeInfo_Annotation_10 aVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  
  sVar4 = internal::WireFormatLite::Int32SizeWithPackedTagSize
                    (&(this->field_0)._impl_.path_,1,&(this->field_0)._impl_._path_cached_byte_size_
                    );
  aVar3 = this->field_0;
  if (((undefined1  [56])aVar3 & (undefined1  [56])0xf) != (undefined1  [56])0x0) {
    if (((undefined1  [56])aVar3 & (undefined1  [56])0x1) != (undefined1  [56])0x0) {
      lVar1 = *(long *)(((ulong)(this->field_0)._impl_.source_file_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc) + 8);
      uVar5 = (uint)lVar1 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar4 = sVar4 + lVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [56])aVar3 & (undefined1  [56])0x2) != (undefined1  [56])0x0) {
      uVar6 = (long)(this->field_0)._impl_.begin_ | 1;
      lVar1 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar1 * 9 + 0x89U >> 6);
    }
    if (((undefined1  [56])aVar3 & (undefined1  [56])0x4) != (undefined1  [56])0x0) {
      uVar6 = (long)(this->field_0)._impl_.end_ | 1;
      lVar1 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar1 * 9 + 0x89U >> 6);
    }
    if (((undefined1  [56])aVar3 & (undefined1  [56])0x8) != (undefined1  [56])0x0) {
      uVar6 = (long)(this->field_0)._impl_.semantic_ | 1;
      lVar1 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar1 * 9 + 0x49U >> 6) + 1;
    }
  }
  sVar4 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar4,&(this->field_0)._impl_._cached_size_);
  return sVar4;
}

Assistant:

::size_t GeneratedCodeInfo_Annotation::ByteSizeLong() const {
  const GeneratedCodeInfo_Annotation& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.GeneratedCodeInfo.Annotation)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated int32 path = 1 [packed = true];
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_path(), 1,
              this_._impl_._path_cached_byte_size_);
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    // optional string source_file = 2;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_source_file());
    }
    // optional int32 begin = 3;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_begin());
    }
    // optional int32 end = 4;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_end());
    }
    // optional .google.protobuf.GeneratedCodeInfo.Annotation.Semantic semantic = 5;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_semantic());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}